

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O1

void __thiscall
ft::
list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::listInit(list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *plVar2
  ;
  node *pnVar3;
  listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  
  pnVar3 = (node *)operator_new(0x30);
  this->m_head = pnVar3;
  pnVar3 = (node *)operator_new(0x30);
  this->m_tail = pnVar3;
  plVar2 = this->m_head;
  local_40 = 0;
  local_38 = 0;
  paVar1 = &local_78.data.field_2;
  local_78.data._M_dataplus._M_p = (pointer)paVar1;
  local_48 = &local_38;
  std::__cxx11::string::_M_construct<char*>((string *)&local_78,&local_38,&local_38);
  local_78.prev =
       (listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
       )0x0;
  local_78.next =
       (listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
       )0x0;
  listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  listNode(plVar2,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.data._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.data._M_dataplus._M_p,local_78.data.field_2._M_allocated_capacity + 1);
  }
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  plVar2 = this->m_tail;
  local_40 = 0;
  local_38 = 0;
  local_78.data._M_dataplus._M_p = (pointer)paVar1;
  local_48 = &local_38;
  std::__cxx11::string::_M_construct<char*>((string *)&local_78,&local_38,&local_38);
  local_78.prev =
       (listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
       )0x0;
  local_78.next =
       (listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
       )0x0;
  listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  listNode(plVar2,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.data._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.data._M_dataplus._M_p,local_78.data.field_2._M_allocated_capacity + 1);
  }
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  pnVar3 = this->m_head;
  plVar2 = this->m_tail;
  pnVar3->next = plVar2;
  plVar2->prev = pnVar3;
  return;
}

Assistant:

void listInit() {
		this->m_head = this->m_alloc.allocate(1);
		this->m_tail = this->m_alloc.allocate(1);
		this->m_alloc.construct(this->m_head, node());
		this->m_alloc.construct(this->m_tail, node());
		this->head()->next = this->tail();
		this->tail()->prev = this->head();
	}